

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O0

void libdef_set(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int arg_local;
  char *p_local;
  BuildCtx *ctx_local;
  
  if (ctx->mode == BUILD_libdef) {
    if ((*p == '!') && (p[1] == '\0')) {
      *p = '\0';
    }
    libdef_name(p,0xc0);
    puVar1 = optr + 1;
    *optr = 0xfa;
    optr = puVar1;
    obuf[2] = obuf[2] + '\x01';
  }
  return;
}

Assistant:

static void libdef_set(BuildCtx *ctx, char *p, int arg)
{
  UNUSED(arg);
  if (ctx->mode == BUILD_libdef) {
    if (p[0] == '!' && p[1] == '\0') p[0] = '\0';  /* Set env. */
    libdef_name(p, LIBINIT_STRING);
    *optr++ = LIBINIT_SET;
    obuf[2]++;  /* Bump hash table size. */
  }
}